

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ssize_t rw::Image::read(int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  char *__dest;
  char *pcVar2;
  long lVar3;
  undefined4 in_register_0000003c;
  Image *img;
  char *found;
  char *ext;
  char *filename;
  int i;
  char *imageName_local;
  
  sVar1 = strlen((char *)CONCAT44(in_register_0000003c,__fd));
  __dest = (char *)mustmalloc_LOC(sVar1 + 0x14,0x10018,
                                  "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 999"
                                 );
  strcpy(__dest,(char *)CONCAT44(in_register_0000003c,__fd));
  sVar1 = strlen(__dest);
  __dest[sVar1] = '.';
  filename._4_4_ = 0;
  do {
    if (*(int *)(engine + 0x100 + (long)imageModuleOffset) <= filename._4_4_) {
      (*DAT_001685f8)(__dest);
      return 0;
    }
    if (*(long *)(engine + imageModuleOffset + (long)filename._4_4_ * 0x18 + 0x18) != 0) {
      strncpy(__dest + sVar1 + 1,
              *(char **)(engine + imageModuleOffset + 0x10 + (long)filename._4_4_ * 0x18),0x13);
      pcVar2 = getFilename(__dest);
      if (pcVar2 != (char *)0x0) {
        lVar3 = (**(code **)(engine + imageModuleOffset + (long)filename._4_4_ * 0x18 + 0x18))
                          (pcVar2);
        (*DAT_001685f8)(pcVar2);
        if (lVar3 != 0) {
          (*DAT_001685f8)(__dest);
          return lVar3;
        }
      }
    }
    filename._4_4_ = filename._4_4_ + 1;
  } while( true );
}

Assistant:

Image*
Image::read(const char *imageName)
{
	int i;
	char *filename, *ext, *found;
	Image *img;

	filename = rwNewT(char, strlen(imageName) + 20, MEMDUR_FUNCTION | ID_IMAGE);
	strcpy(filename, imageName);
	ext = filename + strlen(filename);
	*ext++ = '.';
	// Try all supported extensions
	for(i = 0; i < IMAGEGLOBAL(numFileFormats); i++){
		if(IMAGEGLOBAL(fileFormats)[i].read == nil)
			continue;
		strncpy(ext, IMAGEGLOBAL(fileFormats)[i].extension, 19);
		found = getFilename(filename);
		// Found a file
		if(found){
			img = IMAGEGLOBAL(fileFormats)[i].read(found);
			rwFree(found);
			// It was a valid image of that format
			if(img){
				rwFree(filename);
				return img;
			}
		}
	}
	rwFree(filename);
	return nil;
}